

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  ImU32 key;
  ImGuiDockNode *pIVar1;
  ImGuiDockNode *pIVar2;
  ImGuiDockNode **ppIVar3;
  ImGuiWindow *pIVar4;
  ImGuiDockNode *pIVar5;
  ulong uVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  char host_window_title [20];
  char local_48 [24];
  
  if (0 < node_settings_count) {
    uVar6 = 0;
    do {
      if (node_settings_array[uVar6].ID != 0) {
        pIVar1 = DockContextAddNode(ctx,node_settings_array[uVar6].ID);
        if (node_settings_array[uVar6].ParentNodeId == 0) {
          pIVar2 = (ImGuiDockNode *)0x0;
        }
        else {
          pIVar2 = (ImGuiDockNode *)
                   ImGuiStorage::GetVoidPtr
                             (&(ctx->DockContext).Nodes,node_settings_array[uVar6].ParentNodeId);
        }
        pIVar1->ParentNode = pIVar2;
        auVar10 = pshuflw(ZEXT416((uint)node_settings_array[uVar6].Pos),
                          ZEXT416((uint)node_settings_array[uVar6].Pos),0x60);
        IVar7.x = (float)(auVar10._0_4_ >> 0x10);
        IVar7.y = (float)(auVar10._4_4_ >> 0x10);
        pIVar1->Pos = IVar7;
        auVar10 = pshuflw(ZEXT416((uint)node_settings_array[uVar6].Size),
                          ZEXT416((uint)node_settings_array[uVar6].Size),0x60);
        IVar8.x = (float)(auVar10._0_4_ >> 0x10);
        IVar8.y = (float)(auVar10._4_4_ >> 0x10);
        pIVar1->Size = IVar8;
        auVar10 = pshuflw(ZEXT416((uint)node_settings_array[uVar6].SizeRef),
                          ZEXT416((uint)node_settings_array[uVar6].SizeRef),0x60);
        IVar9.x = (float)(auVar10._0_4_ >> 0x10);
        IVar9.y = (float)(auVar10._4_4_ >> 0x10);
        pIVar1->SizeRef = IVar9;
        *(ushort *)&pIVar1->field_0xb8 = *(ushort *)&pIVar1->field_0xb8 & 0xfe00 | 0x49;
        if (pIVar2 != (ImGuiDockNode *)0x0) {
          if (pIVar2->ChildNodes[0] == (ImGuiDockNode *)0x0) {
            ppIVar3 = pIVar2->ChildNodes;
          }
          else {
            if (pIVar2->ChildNodes[1] != (ImGuiDockNode *)0x0) goto LAB_0013a2cc;
            ppIVar3 = pIVar2->ChildNodes + 1;
          }
          *ppIVar3 = pIVar1;
        }
LAB_0013a2cc:
        pIVar1->SelectedTabId = node_settings_array[uVar6].SelectedWindowId;
        pIVar1->SplitAxis = (int)node_settings_array[uVar6].SplitAxis;
        pIVar1->LocalFlags = pIVar1->LocalFlags | node_settings_array[uVar6].Flags & 0x61fc20U;
        pIVar2 = pIVar1;
        do {
          pIVar5 = pIVar2;
          pIVar2 = pIVar5->ParentNode;
        } while (pIVar2 != (ImGuiDockNode *)0x0);
        ImFormatString(local_48,0x14,"##DockNode_%02X",(ulong)pIVar5->ID);
        key = ImHashStr(local_48,0,0);
        pIVar4 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
        pIVar1->HostWindow = pIVar4;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)node_settings_count);
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedWindowId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->LocalFlags |= (settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}